

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QCalendarWidgetPrivate::createNavigationBar(QCalendarWidgetPrivate *this,QWidget *widget)

{
  QSpinBox *pQVar1;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView str_03;
  QLatin1StringView str_04;
  int iVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QToolButton *pQVar5;
  QCalToolButton *pQVar6;
  QMenu *pQVar7;
  QAction *pQVar8;
  QAction **ppQVar9;
  QWidget *parent;
  QWidget *this_00;
  QFont *pQVar10;
  QCalendarWidgetPrivate *this_01;
  QWidget *pQVar11;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QHBoxLayout *headerLayout;
  QAction *act;
  int e;
  QCalendarWidget *q;
  QString monthName;
  int i;
  QFont font;
  QWidget *in_stack_fffffffffffffd28;
  FocusPolicy policy;
  QWidget *in_stack_fffffffffffffd30;
  QCalendarModel *in_stack_fffffffffffffd38;
  undefined1 enable;
  QMargins *margins;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar12;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd4c;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 uVar14;
  QWidget *in_stack_fffffffffffffd58;
  QCalendarWidgetPrivate *in_stack_fffffffffffffd68;
  QLocale local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  int local_54;
  undefined1 local_3c [4];
  undefined1 *local_38;
  undefined1 *puStack_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(in_RDI)->super_QWidget;
  pQVar4 = (QWidget *)operator_new(0x28);
  memset(local_3c,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x51b66c);
  QWidget::QWidget((QWidget *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (QWidget *)in_stack_fffffffffffffd38,(WindowFlags)in_stack_fffffffffffffd4c.i);
  in_RDI->navBarBackground = pQVar4;
  pQVar4 = in_RDI->navBarBackground;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
  str.m_size._4_4_ = in_stack_fffffffffffffd44;
  str.m_size._0_4_ = in_stack_fffffffffffffd40;
  str.m_data._0_4_ = in_stack_fffffffffffffd48;
  str.m_data._4_4_ = in_stack_fffffffffffffd4c.i;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffd38,str);
  QObject::setObjectName((QAnyStringView *)pQVar4);
  QWidget::setAutoFillBackground
            ((QWidget *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  QWidget::setBackgroundRole
            (in_stack_fffffffffffffd30,(ColorRole)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  pQVar5 = (QToolButton *)operator_new(0x28);
  QtPrivate::QPrevNextCalButton::QPrevNextCalButton
            ((QPrevNextCalButton *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  in_RDI->prevMonth = pQVar5;
  pQVar5 = (QToolButton *)operator_new(0x28);
  QtPrivate::QPrevNextCalButton::QPrevNextCalButton
            ((QPrevNextCalButton *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  in_RDI->nextMonth = pQVar5;
  QToolButton::setAutoRaise
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  QToolButton::setAutoRaise
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  QWidget::setSizePolicy
            (in_stack_fffffffffffffd30,(Policy)((ulong)in_stack_fffffffffffffd28 >> 0x20),
             (Policy)in_stack_fffffffffffffd28);
  QWidget::setSizePolicy
            (in_stack_fffffffffffffd30,(Policy)((ulong)in_stack_fffffffffffffd28 >> 0x20),
             (Policy)in_stack_fffffffffffffd28);
  QToolButton::setAutoRaise
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  updateButtonIcons(in_stack_fffffffffffffd68);
  QAbstractButton::setAutoRepeat
            ((QAbstractButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  QAbstractButton::setAutoRepeat
            ((QAbstractButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  pQVar6 = (QCalToolButton *)operator_new(0x28);
  QtPrivate::QCalToolButton::QCalToolButton
            ((QCalToolButton *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  in_RDI->monthButton = pQVar6;
  QWidget::setSizePolicy
            (in_stack_fffffffffffffd30,(Policy)((ulong)in_stack_fffffffffffffd28 >> 0x20),
             (Policy)in_stack_fffffffffffffd28);
  QToolButton::setAutoRaise
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  QToolButton::setPopupMode
            ((QToolButton *)in_stack_fffffffffffffd30,
             (ToolButtonPopupMode)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  pQVar7 = (QMenu *)operator_new(0x28);
  QMenu::QMenu((QMenu *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (QWidget *)CONCAT44(in_stack_fffffffffffffd4c.i,in_stack_fffffffffffffd48));
  in_RDI->monthMenu = pQVar7;
  local_54 = 1;
  iVar2 = QCalendar::maximumMonthsInYear();
  for (; local_54 <= iVar2; local_54 = local_54 + 1) {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale((QWidget *)in_stack_fffffffffffffd38);
    QtPrivate::QCalendarModel::monthName
              (in_stack_fffffffffffffd38,(QLocale *)in_stack_fffffffffffffd30,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    QLocale::~QLocale(&local_78);
    pQVar8 = QWidget::addAction((QWidget *)
                                CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                (QString *)in_stack_fffffffffffffd38);
    ::QVariant::QVariant(&local_28,local_54);
    QAction::setData((QVariant *)pQVar8);
    ::QVariant::~QVariant(&local_28);
    ppQVar9 = QMap<int,_QAction_*>::operator[]
                        ((QMap<int,_QAction_*> *)
                         CONCAT44(in_stack_fffffffffffffd4c.i,in_stack_fffffffffffffd48),
                         (int *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    *ppQVar9 = pQVar8;
    QString::~QString((QString *)0x51baa6);
  }
  QToolButton::setMenu
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd4c.i,in_stack_fffffffffffffd48),
             (QMenu *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  uVar12 = 0x28;
  uVar13 = 0;
  parent = (QWidget *)operator_new(0x28);
  QtPrivate::QCalToolButton::QCalToolButton((QCalToolButton *)in_stack_fffffffffffffd30,parent);
  in_RDI->yearButton = (QCalToolButton *)parent;
  uVar14 = 1;
  QWidget::setSizePolicy(in_stack_fffffffffffffd30,(Policy)((ulong)parent >> 0x20),(Policy)parent);
  QToolButton::setAutoRaise
            ((QToolButton *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  this_00 = (QWidget *)operator_new(CONCAT44(uVar13,uVar12));
  QSpinBox::QSpinBox((QSpinBox *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (QWidget *)in_stack_fffffffffffffd38);
  enable = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
  in_RDI->yearEdit = (QSpinBox *)this_00;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = QWidget::font(pQVar3);
  QFont::QFont((QFont *)&local_38,pQVar10);
  QFont::setBold((QFont *)this_00,SUB81((ulong)parent >> 0x38,0));
  QWidget::setFont(in_stack_fffffffffffffd58,(QFont *)CONCAT44(uVar14,in_stack_fffffffffffffd50));
  QWidget::setFont(in_stack_fffffffffffffd58,(QFont *)CONCAT44(uVar14,in_stack_fffffffffffffd50));
  QAbstractSpinBox::setFrame
            ((QAbstractSpinBox *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (bool)enable);
  margins = (QMargins *)in_RDI->yearEdit;
  QDate::year(&in_RDI->m_model->m_minimumDate,*(undefined8 *)&in_RDI->m_model->m_calendar);
  QSpinBox::setMinimum((QSpinBox *)CONCAT44(uVar13,uVar12),in_stack_fffffffffffffd44);
  uVar14 = SUB84(in_RDI->yearEdit,0);
  iVar2 = (int)((ulong)in_RDI->yearEdit >> 0x20);
  QDate::year(&in_RDI->m_model->m_maximumDate,*(undefined8 *)&in_RDI->m_model->m_calendar);
  QSpinBox::setMaximum((QSpinBox *)CONCAT44(uVar13,uVar12),iVar2);
  QWidget::hide((QWidget *)0x51bcbe);
  this_01 = (QCalendarWidgetPrivate *)operator_new(CONCAT44(uVar13,uVar12));
  QSpacerItem::QSpacerItem
            ((QSpacerItem *)CONCAT44(iVar2,uVar14),(int)((ulong)margins >> 0x20),(int)margins,
             (Policy)((ulong)this_00 >> 0x20),(Policy)this_00);
  in_RDI->spaceHolder = (QSpacerItem *)this_01;
  pQVar11 = (QWidget *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_00);
  pQVar4 = pQVar11;
  pQVar3 = pQVar11;
  QMargins::QMargins((QMargins *)this_00);
  QLayout::setContentsMargins((QLayout *)CONCAT44(iVar2,uVar14),margins);
  (**(code **)(*(long *)pQVar11 + 0x68))(pQVar11,0);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51bd9d);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,parent,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)margins >> 0x20,0));
  (**(code **)(*(long *)pQVar11 + 200))();
  QBoxLayout::insertStretch((QBoxLayout *)pQVar4,(int)((ulong)this_01 >> 0x20),(int)this_01);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51be1f);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,parent,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)margins >> 0x20,0));
  (**(code **)(*(long *)pQVar11 + 0x80))(pQVar11,in_RDI->spaceHolder);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51be9b);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,parent,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)margins >> 0x20,0));
  (**(code **)(*(long *)pQVar11 + 200))();
  QBoxLayout::insertStretch((QBoxLayout *)pQVar4,(int)((ulong)this_01 >> 0x20),(int)this_01);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51bf2c);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,parent,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)margins >> 0x20,0));
  policy = (FocusPolicy)((ulong)parent >> 0x20);
  QWidget::setLayout(pQVar3,(QLayout *)pQVar4);
  QWidget::setFocusPolicy(this_00,policy);
  QWidget::setFocusPolicy(this_00,policy);
  QWidget::setFocusPolicy(this_00,policy);
  QWidget::setFocusPolicy(this_00,policy);
  QWidget::setFocusPolicy(this_00,policy);
  pQVar5 = in_RDI->prevMonth;
  Qt::Literals::StringLiterals::operator____L1((char *)margins,(size_t)this_00);
  str_00.m_size._4_4_ = iVar2;
  str_00.m_size._0_4_ = uVar14;
  str_00.m_data._0_4_ = uVar12;
  str_00.m_data._4_4_ = uVar13;
  QAnyStringView::QAnyStringView((QAnyStringView *)margins,str_00);
  QObject::setObjectName((QAnyStringView *)pQVar5);
  pQVar5 = in_RDI->nextMonth;
  Qt::Literals::StringLiterals::operator____L1((char *)margins,(size_t)this_00);
  str_01.m_size._4_4_ = iVar2;
  str_01.m_size._0_4_ = uVar14;
  str_01.m_data._0_4_ = uVar12;
  str_01.m_data._4_4_ = uVar13;
  QAnyStringView::QAnyStringView((QAnyStringView *)margins,str_01);
  QObject::setObjectName((QAnyStringView *)pQVar5);
  pQVar6 = in_RDI->monthButton;
  Qt::Literals::StringLiterals::operator____L1((char *)margins,(size_t)this_00);
  str_02.m_size._4_4_ = iVar2;
  str_02.m_size._0_4_ = uVar14;
  str_02.m_data._0_4_ = uVar12;
  str_02.m_data._4_4_ = uVar13;
  QAnyStringView::QAnyStringView((QAnyStringView *)margins,str_02);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  pQVar6 = in_RDI->yearButton;
  Qt::Literals::StringLiterals::operator____L1((char *)margins,(size_t)this_00);
  str_03.m_size._4_4_ = iVar2;
  str_03.m_size._0_4_ = uVar14;
  str_03.m_data._0_4_ = uVar12;
  str_03.m_data._4_4_ = uVar13;
  QAnyStringView::QAnyStringView((QAnyStringView *)margins,str_03);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  pQVar1 = in_RDI->yearEdit;
  Qt::Literals::StringLiterals::operator____L1((char *)margins,(size_t)this_00);
  str_04.m_size._4_4_ = iVar2;
  str_04.m_size._0_4_ = uVar14;
  str_04.m_data._0_4_ = uVar12;
  str_04.m_data._4_4_ = uVar13;
  QAnyStringView::QAnyStringView((QAnyStringView *)margins,str_04);
  QObject::setObjectName((QAnyStringView *)pQVar1);
  updateMonthMenu(this_01);
  QDate::year(&in_RDI->m_model->m_date,*(undefined8 *)&in_RDI->m_model->m_calendar);
  QDate::month(&in_RDI->m_model->m_date,*(undefined8 *)&in_RDI->m_model->m_calendar);
  showMonth((QCalendarWidgetPrivate *)CONCAT44(iVar2,uVar14),(int)((ulong)margins >> 0x20),
            (int)margins);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::createNavigationBar(QWidget *widget)
{
    Q_Q(QCalendarWidget);
    navBarBackground = new QWidget(widget);
    navBarBackground->setObjectName("qt_calendar_navigationbar"_L1);
    navBarBackground->setAutoFillBackground(true);
    navBarBackground->setBackgroundRole(QPalette::Highlight);

    prevMonth = new QPrevNextCalButton(navBarBackground);
    nextMonth = new QPrevNextCalButton(navBarBackground);
    prevMonth->setAutoRaise(true);
    nextMonth->setAutoRaise(true);
    prevMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setAutoRaise(true);
    updateButtonIcons();
    prevMonth->setAutoRepeat(true);
    nextMonth->setAutoRepeat(true);

    monthButton = new QCalToolButton(navBarBackground);
    monthButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    monthButton->setAutoRaise(true);
    monthButton->setPopupMode(QToolButton::InstantPopup);
    monthMenu = new QMenu(monthButton);
    for (int i = 1, e = m_model->m_calendar.maximumMonthsInYear(); i <= e; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        QAction *act = monthMenu->addAction(monthName);
        act->setData(i);
        monthToAction[i] = act;
    }
    monthButton->setMenu(monthMenu);
    yearButton = new QCalToolButton(navBarBackground);
    yearButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    yearButton->setAutoRaise(true);
    yearEdit = new QSpinBox(navBarBackground);

    QFont font = q->font();
    font.setBold(true);
    monthButton->setFont(font);
    yearButton->setFont(font);
    yearEdit->setFrame(false);
    yearEdit->setMinimum(m_model->m_minimumDate.year(m_model->m_calendar));
    yearEdit->setMaximum(m_model->m_maximumDate.year(m_model->m_calendar));
    yearEdit->hide();
    spaceHolder = new QSpacerItem(0,0);

    QHBoxLayout *headerLayout = new QHBoxLayout;
    headerLayout->setContentsMargins(QMargins());
    headerLayout->setSpacing(0);
    headerLayout->addWidget(prevMonth);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(monthButton);
    headerLayout->addItem(spaceHolder);
    headerLayout->addWidget(yearButton);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(nextMonth);
    navBarBackground->setLayout(headerLayout);

    yearEdit->setFocusPolicy(Qt::StrongFocus);
    prevMonth->setFocusPolicy(Qt::NoFocus);
    nextMonth->setFocusPolicy(Qt::NoFocus);
    yearButton->setFocusPolicy(Qt::NoFocus);
    monthButton->setFocusPolicy(Qt::NoFocus);

    //set names for the header controls.
    prevMonth->setObjectName("qt_calendar_prevmonth"_L1);
    nextMonth->setObjectName("qt_calendar_nextmonth"_L1);
    monthButton->setObjectName("qt_calendar_monthbutton"_L1);
    yearButton->setObjectName("qt_calendar_yearbutton"_L1);
    yearEdit->setObjectName("qt_calendar_yearedit"_L1);

    updateMonthMenu();
    showMonth(m_model->m_date.year(m_model->m_calendar), m_model->m_date.month(m_model->m_calendar));
}